

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void __thiscall kratos::AssertPropertyVisitor::visit(AssertPropertyVisitor *this,AssertBase *stmt)

{
  _func_int *p_Var1;
  Sequence *this_00;
  pointer psVar2;
  pointer pbVar3;
  int iVar4;
  Generator *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StmtException *this_02;
  iterator __begin4;
  pointer pbVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar7 [8];
  undefined1 auVar8 [8];
  basic_string_view<char> bVar9;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  undefined1 local_120 [8];
  shared_ptr<kratos::AssertPropertyStmt> property_stmt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  clk_ports;
  undefined1 local_b0 [8];
  shared_ptr<kratos::Port> clk;
  shared_ptr<kratos::VarCasted> casted;
  Var *src_var;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> clk_vars;
  undefined1 auStack_68 [8];
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  children;
  undefined1 auStack_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  clks;
  
  iVar4 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[0xd])(stmt);
  if (iVar4 == 1) {
    Stmt::as<kratos::AssertPropertyStmt>((Stmt *)local_120);
    p_Var1 = *(_func_int **)((long)local_120 + 0xc0);
    if ((*(long *)(p_Var1 + 0x38) == 0) &&
       (this_00 = *(Sequence **)(p_Var1 + 0x20),
       (this_00->next_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0)) {
      src_var = (Var *)0x0;
      clk_vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      clk_vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      this_01 = Stmt::generator_parent(&stmt->super_Stmt);
      Generator::get_ports_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&property_stmt.
                     super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,this_01,Clock);
      if ((long)clk_ports.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start -
          (long)property_stmt.
                super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi == 0x20) {
        Generator::get_port((Generator *)auStack_68,(string *)this_01);
        auStack_48 = auStack_68;
        std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Port*>
                  ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&src_var,(Port **)auStack_48
                  );
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&children);
      }
      else {
        for (_Var6 = property_stmt.
                     super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
            (pointer)_Var6._M_pi !=
            clk_ports.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start; _Var6._M_pi = _Var6._M_pi + 0x20) {
          Generator::get_port((Generator *)auStack_68,(string *)this_01);
          auStack_48 = auStack_68;
          std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Port*>
                    ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&src_var,
                     (Port **)auStack_48);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&children);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&property_stmt.
                    super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      if (src_var ==
          (Var *)clk_vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                 super__Vector_impl_data._M_start) {
        Generator::get_child_generators
                  ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                    *)auStack_68,this_01);
        psVar2 = children.
                 super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (auVar7 = auStack_68; auVar7 != (undefined1  [8])psVar2;
            auVar7 = (undefined1  [8])
                     &(((Var *)&((element_type *)auVar7)->super_IRNode)->super_IRNode).fn_name_ln.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          Generator::get_ports_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_48,
                     (Generator *)
                     (((Var *)&((element_type *)auVar7)->super_IRNode)->super_IRNode)._vptr_IRNode,
                     Clock);
          pbVar3 = clks.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          for (auVar8 = auStack_48; auVar8 != (undefined1  [8])pbVar3;
              auVar8 = (undefined1  [8])
                       &(((Var *)&((element_type *)auVar8)->super_IRNode)->super_IRNode).verilog_ln)
          {
            Generator::get_port((Generator *)local_b0,
                                (string *)
                                (((Var *)&((element_type *)auVar7)->super_IRNode)->super_IRNode).
                                _vptr_IRNode);
            iVar4 = (*(*(_func_int ***)local_b0)[0x10])();
            std::
            _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)&property_stmt.
                             super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,
                         (_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)CONCAT44(extraout_var,iVar4));
            pbVar5 = (pointer)&clk_ports.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
            while (pbVar5 = *(pointer *)&pbVar5->_M_dataplus, pbVar5 != (pointer)0x0) {
              casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       (pbVar5->_M_string_length + 200);
              iVar4 = (*(casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_vptr__Sp_counted_base[0xd])();
              if (((Generator *)CONCAT44(extraout_var_00,iVar4) == this_01) &&
                 (casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[0x16]._M_use_count == 6)) {
                Var::as<kratos::VarCasted>
                          ((Var *)&clk.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
                if (*(int *)&clk.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[0x28]._vptr__Sp_counted_base == 2) {
                  std::vector<kratos::Var*,std::allocator<kratos::Var*>>::
                  emplace_back<kratos::Var*&>
                            ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&src_var,
                             (Var **)&casted.
                                      super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&casted);
              }
            }
            std::
            _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&property_stmt.
                              super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&clk);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_48);
        }
        std::
        vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
        ::~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   *)auStack_68);
      }
      if ((long)clk_vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                super__Vector_impl_data._M_start - (long)src_var != 8) {
        this_02 = (StmtException *)__cxa_allocate_exception(0x10);
        Sequence::to_string_abi_cxx11_((string *)auStack_68,this_00);
        auStack_48 = auStack_68;
        clks.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)children.
                      super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        bVar9 = fmt::v7::to_string_view<char,_0>("Clock edge not set for sequence {0}");
        format_str.data_ = (char *)bVar9.size_;
        format_str.size_ = 0xd;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_48;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)
                   &property_stmt.
                    super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(detail *)bVar9.data_,format_str,args);
        __l._M_len = 1;
        __l._M_array = (iterator)local_b0;
        local_b0 = (undefined1  [8])stmt;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_48,__l,
                   (allocator_type *)
                   &clk.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        StmtException::StmtException
                  (this_02,(string *)
                           &property_stmt.
                            super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,
                   (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_48);
        __cxa_throw(this_02,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
      *(_func_int ***)(p_Var1 + 0x38) = (src_var->super_IRNode)._vptr_IRNode;
      *(undefined8 *)(p_Var1 + 0x40) = 1;
      std::_Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>::~_Vector_base
                ((_Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)&src_var);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&property_stmt);
  }
  return;
}

Assistant:

void visit(AssertBase* stmt) override {
        if (stmt->assert_type() != AssertType::AssertProperty) {
            return;
        }
        auto property_stmt = stmt->as<AssertPropertyStmt>();
        auto* property = property_stmt->property();

        auto& edge = property->edge();
        auto* seq = property->sequence();
        // automatically determine the clock, only if it's safe to do so (only one clock in the
        // design
        if (!edge.var && seq->next()) {
            std::vector<Var*> clk_vars;
            // try to determine the clock
            // it's a concurrent property, we have to have a clock
            auto* generator = stmt->generator_parent();
            {
                auto clk_ports = generator->get_ports(PortType::Clock);
                if (clk_ports.size() == 1) {
                    // that's it
                    clk_vars.emplace_back(generator->get_port(clk_ports.front()).get());
                } else {
                    for (auto const& port_name : clk_ports) {
                        clk_vars.emplace_back(generator->get_port(port_name).get());
                    }
                }
            }
            if (clk_vars.empty()) {
                // there might be some casted types, typically in test bench
                // we need to source for connected modules to see what they are connected to
                auto children = generator->get_child_generators();
                for (auto const& gen : children) {
                    auto clks = gen->get_ports(PortType::Clock);
                    for (auto const& clk_name : clks) {
                        auto clk = gen->get_port(clk_name);
                        auto source = clk->sources();
                        for (auto const& assign : source) {
                            auto* src_var = assign->right();
                            if (src_var->generator() == generator) {
                                if (src_var->type() == VarType::BaseCasted) {
                                    // only casted to clock
                                    auto casted = src_var->as<VarCasted>();
                                    if (casted->cast_type() == VarCastType::Clock)
                                        clk_vars.emplace_back(src_var);
                                }
                            }
                        }
                    }
                }
            }

            if (clk_vars.size() == 1) {
                edge.var = clk_vars[0];
                edge.edge = EventEdgeType::Posedge;
                edge.type = EventControlType::Edge;
            } else {
                // next is not null but edge is not set
                throw StmtException(
                    ::format("Clock edge not set for sequence {0}", seq->to_string()), {stmt});
            }
        }
    }